

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_unwrap_shared(container_t *candidate_shared_container,uint8_t *type)

{
  uint8_t *type_local;
  container_t *candidate_shared_container_local;
  
  candidate_shared_container_local = candidate_shared_container;
  if (*type == '\x04') {
    *type = *(uint8_t *)((long)candidate_shared_container + 8);
    if (*type == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    candidate_shared_container_local = *candidate_shared_container;
  }
  return candidate_shared_container_local;
}

Assistant:

static inline const container_t *container_unwrap_shared(
    const container_t *candidate_shared_container, uint8_t *type
){
    if (*type == SHARED_CONTAINER_TYPE) {
        *type = const_CAST_shared(candidate_shared_container)->typecode;
        assert(*type != SHARED_CONTAINER_TYPE);
        return const_CAST_shared(candidate_shared_container)->container;
    } else {
        return candidate_shared_container;
    }
}